

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O0

void __thiscall PFData_test_loadData_Test::TestBody(PFData_test_loadData_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  int __fd;
  AssertHelper *this_00;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  double *data;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int retval;
  PFData test;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  void **in_stack_fffffffffffffcd8;
  char *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  int line;
  char *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffcf8;
  Type type;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  AssertHelper *in_stack_fffffffffffffd50;
  PFData *in_stack_fffffffffffffd88;
  PFData *this_01;
  double in_stack_fffffffffffffdb0;
  double in_stack_fffffffffffffdb8;
  double in_stack_fffffffffffffdc0;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  AssertionResult local_220 [2];
  AssertionResult local_200 [2];
  AssertionResult local_1e0 [2];
  AssertionResult local_1c0 [2];
  AssertionResult local_1a0 [2];
  AssertionResult local_180 [2];
  undefined8 local_160;
  AssertionResult local_158;
  double *local_148;
  undefined4 local_12c;
  AssertionResult local_128;
  uint local_114;
  undefined4 local_fc;
  AssertionResult local_f8;
  int local_e8;
  undefined1 local_d1 [33];
  PFData local_b0;
  
  this_01 = (PFData *)local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_d1 + 1),"tests/inputs/press.init.pfb",(allocator *)this_01);
  PFData::PFData((PFData *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                 in_stack_fffffffffffffcf8);
  type = (Type)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
  std::__cxx11::string::~string((string *)(local_d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d1);
  local_e8 = PFData::loadHeader(this_01);
  local_fc = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffce0,(int *)in_stack_fffffffffffffcd8,
             (int *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    testing::AssertionResult::failure_message((AssertionResult *)0x10ff21);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),type,
               in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,in_stack_fffffffffffffce0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd50,
               (Message *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    testing::Message::~Message((Message *)0x10ff84);
  }
  local_114 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fff2);
  if (local_114 == 0) {
    local_e8 = PFData::loadData(in_stack_fffffffffffffd88);
    local_12c = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
               in_stack_fffffffffffffce0,(int *)in_stack_fffffffffffffcd8,
               (int *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
      testing::AssertionResult::failure_message((AssertionResult *)0x1100ce);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),type,
                 in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,in_stack_fffffffffffffce0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffd50,
                 (Message *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
      testing::Message::~Message((Message *)0x110131);
    }
    local_114 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11019f);
    if (local_114 == 0) {
      local_148 = PFData::getData(&local_b0);
      local_160 = 0;
      testing::internal::CmpHelperNE<decltype(nullptr),double*>
                ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                 in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                 (double **)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
        testing::AssertionResult::failure_message((AssertionResult *)0x11027f);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                   type,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
                   in_stack_fffffffffffffce0);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd50,
                   (Message *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        testing::Message::~Message((Message *)0x1102e2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x11033a);
      PFData::operator()(&local_b0,0,0,0);
      testing::internal::DoubleNearPredFormat
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                 (char *)in_stack_fffffffffffffdc8._M_head_impl,in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_180);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
        testing::AssertionResult::failure_message((AssertionResult *)0x110404);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                   type,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
                   in_stack_fffffffffffffce0);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd50,
                   (Message *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        testing::Message::~Message((Message *)0x110467);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1104bf);
      this_00 = (AssertHelper *)PFData::operator()(&local_b0,0,0,0x28);
      testing::internal::DoubleNearPredFormat
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                 (char *)in_stack_fffffffffffffdc8._M_head_impl,in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      uVar2 = testing::AssertionResult::operator_cast_to_bool(local_1a0);
      if (!(bool)uVar2) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
        testing::AssertionResult::failure_message((AssertionResult *)0x11058c);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                   type,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
                   in_stack_fffffffffffffce0);
        testing::internal::AssertHelper::operator=
                  (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd48));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        testing::Message::~Message((Message *)0x1105e9);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x110641);
      PFData::operator()(&local_b0,0,1,0);
      testing::internal::DoubleNearPredFormat
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                 (char *)in_stack_fffffffffffffdc8._M_head_impl,in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c0);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
        testing::AssertionResult::failure_message((AssertionResult *)0x110702);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                   type,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
                   in_stack_fffffffffffffce0);
        testing::internal::AssertHelper::operator=
                  (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd48));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        testing::Message::~Message((Message *)0x11075f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1107b7);
      PFData::operator()(&local_b0,0,0,1);
      testing::internal::DoubleNearPredFormat
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                 (char *)in_stack_fffffffffffffdc8._M_head_impl,in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e0);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
        testing::AssertionResult::failure_message((AssertionResult *)0x110878);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                   type,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
                   in_stack_fffffffffffffce0);
        testing::internal::AssertHelper::operator=
                  (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd48));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        testing::Message::~Message((Message *)0x1108d5);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x11092d);
      PFData::operator()(&local_b0,2,1,0x15);
      testing::internal::DoubleNearPredFormat
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                 (char *)in_stack_fffffffffffffdc8._M_head_impl,in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      uVar3 = testing::AssertionResult::operator_cast_to_bool(local_200);
      if (!(bool)uVar3) {
        testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffffd00));
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x1109f4);
        type = (Type)((ulong)pcVar4 >> 0x20);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffd00),type,
                   in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,in_stack_fffffffffffffce0);
        testing::internal::AssertHelper::operator=
                  (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd48));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        testing::Message::~Message((Message *)0x110a51);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x110aa9);
      pcVar4 = (char *)PFData::operator()(&local_b0,0x2d,1,0);
      testing::internal::DoubleNearPredFormat
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                 (char *)in_stack_fffffffffffffdc8._M_head_impl,in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_220);
      line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcec);
      if (!bVar1) {
        testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffffd00));
        in_stack_fffffffffffffce0 =
             testing::AssertionResult::failure_message((AssertionResult *)0x110b6d);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffd00),type,pcVar4,line,
                   in_stack_fffffffffffffce0);
        testing::internal::AssertHelper::operator=
                  (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd48));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        testing::Message::~Message((Message *)0x110bca);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x110c22);
      PFData::operator()(&local_b0,0,1,0x16);
      __fd = 0x184253;
      testing::internal::DoubleNearPredFormat
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                 (char *)in_stack_fffffffffffffdc8._M_head_impl,in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      in_stack_fffffffffffffcd7 =
           testing::AssertionResult::operator_cast_to_bool
                     ((AssertionResult *)&stack0xfffffffffffffdc0);
      if (!(bool)in_stack_fffffffffffffcd7) {
        testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffffd00));
        testing::AssertionResult::failure_message((AssertionResult *)0x110ce6);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffd00),type,pcVar4,line,
                   in_stack_fffffffffffffce0);
        __fd = (int)&stack0xfffffffffffffdb8;
        testing::internal::AssertHelper::operator=
                  (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd48));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        testing::Message::~Message((Message *)0x110d41);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x110d96);
      PFData::close(&local_b0,__fd);
      local_114 = 0;
    }
  }
  PFData::~PFData((PFData *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
  return;
}

Assistant:

TEST_F(PFData_test, loadData) {
    // this file needs to exist, and should load
    PFData test("tests/inputs/press.init.pfb");
    int retval = test.loadHeader();
    ASSERT_EQ(0,retval);
    retval = test.loadData();
    ASSERT_EQ(0,retval);
    double* data = test.getData();
    EXPECT_NE(nullptr, data);
    EXPECT_NEAR(98.003604098773,test(0,0,0),1E-12);
    EXPECT_NEAR(97.36460429313328,test(0,0,40),1E-12);
    EXPECT_NEAR(98.0043134691891,test(0,1,0),1E-12);
    EXPECT_NEAR(98.00901307022781,test(0,0,1),1E-12);
    EXPECT_NEAR(92.61370155558751,test(2,1,21),1E-12);
    EXPECT_NEAR(7.98008728357588,test(45,1,0),1E-12);
    EXPECT_NEAR(97.30205516102234,test(0,1,22),1E-12);
    test.close();
}